

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O0

void my_canvas_draw_config(t_my_canvas *x,_glist *glist)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  _glist *p_Var4;
  undefined8 in_stack_fffffffffffffee0;
  undefined4 uVar5;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 uVar7;
  undefined8 uVar6;
  int local_104;
  int local_ec;
  undefined4 local_e8 [2];
  t_atom fontatoms [3];
  char tag [128];
  int offset;
  int ypos;
  int xpos;
  _glist *canvas;
  int zoom;
  _glist *glist_local;
  t_my_canvas *x_local;
  
  uVar7 = (undefined4)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  uVar5 = (undefined4)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  iVar1 = ((x->x_gui).x_glist)->gl_zoom;
  p_Var4 = glist_getcanvas(glist);
  uVar2 = text_xpix((t_text *)x,glist);
  iVar3 = text_ypix((t_text *)x,glist);
  local_ec = iVar1;
  if (iVar1 < 2) {
    local_ec = 0;
  }
  local_e8[0] = 2;
  fontatoms[0]._0_8_ = gensym((x->x_gui).x_font);
  fontatoms[0].a_w.w_float = 1.4013e-45;
  fontatoms[1].a_type = (t_atomtype)(float)(-(x->x_gui).x_fontsize * iVar1);
  fontatoms[1].a_w.w_float = 2.8026e-45;
  fontatoms[2]._0_8_ = gensym(sys_fontweight);
  sprintf((char *)&fontatoms[2].a_w.w_index,"%lxRECT",x);
  uVar6 = CONCAT44(uVar7,iVar3 + x->x_vis_h * iVar1);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var4,"coords",&fontatoms[2].a_w,(ulong)uVar2,iVar3,
              CONCAT44(uVar5,uVar2 + x->x_vis_w * iVar1),uVar6);
  uVar5 = 0;
  uVar6 = CONCAT44((int)((ulong)uVar6 >> 0x20),(x->x_gui).x_bcol);
  pdgui_vmess((char *)0x0,"crs rk rk",p_Var4,"itemconfigure",&fontatoms[2].a_w,"-fill",
              (x->x_gui).x_bcol,"-outline",uVar6);
  uVar7 = (undefined4)((ulong)uVar6 >> 0x20);
  sprintf((char *)&fontatoms[2].a_w.w_index,"%lxBASE",x);
  uVar6 = CONCAT44(uVar7,iVar3 + local_ec + (x->x_gui).x_h);
  pdgui_vmess((char *)0x0,"crs iiii",p_Var4,"coords",&fontatoms[2].a_w,(ulong)(uVar2 + local_ec),
              iVar3 + local_ec,CONCAT44(uVar5,uVar2 + local_ec + (x->x_gui).x_w),uVar6);
  if (((uint)(x->x_gui).x_fsf >> 0x18 & 1) == 0) {
    local_104 = (x->x_gui).x_bcol;
  }
  else {
    local_104 = 0xff;
  }
  pdgui_vmess((char *)0x0,"crs ri rk",p_Var4,"itemconfigure",&fontatoms[2].a_w,"-width",iVar1,
              "-outline",CONCAT44((int)((ulong)uVar6 >> 0x20),local_104));
  sprintf((char *)&fontatoms[2].a_w.w_index,"%lxLABEL",x);
  pdgui_vmess((char *)0x0,"crs ii",p_Var4,"coords",&fontatoms[2].a_w,
              (ulong)(uVar2 + (x->x_gui).x_ldx * iVar1),iVar3 + (x->x_gui).x_ldy * iVar1);
  pdgui_vmess((char *)0x0,"crs rA rk",p_Var4,"itemconfigure",&fontatoms[2].a_w,"-font",3,local_e8,
              "-fill",(x->x_gui).x_lcol);
  iemgui_dolabel(x,&x->x_gui,(x->x_gui).x_lab,1);
  return;
}

Assistant:

static void my_canvas_draw_config(t_my_canvas* x, t_glist* glist)
{
    const int zoom = IEMGUI_ZOOM(x);
    t_canvas *canvas = glist_getcanvas(glist);
    int xpos = text_xpix(&x->x_gui.x_obj, glist);
    int ypos = text_ypix(&x->x_gui.x_obj, glist);
    int offset = (zoom > 1 ? zoom : 0); /* keep zoomed border inside visible area */
    char tag[128];
    t_atom fontatoms[3];
    SETSYMBOL(fontatoms+0, gensym(x->x_gui.x_font));
    SETFLOAT (fontatoms+1, -(x->x_gui.x_fontsize)*zoom);
    SETSYMBOL(fontatoms+2, gensym(sys_fontweight));

    sprintf(tag, "%lxRECT", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        xpos, ypos, xpos + x->x_vis_w * zoom, ypos + x->x_vis_h * zoom);
    pdgui_vmess(0, "crs rk rk", canvas, "itemconfigure", tag,
        "-fill", x->x_gui.x_bcol,
        "-outline", x->x_gui.x_bcol);

    sprintf(tag, "%lxBASE", x);
    pdgui_vmess(0, "crs iiii", canvas, "coords", tag,
        xpos + offset, ypos + offset,
        xpos + offset + x->x_gui.x_w, ypos + offset + x->x_gui.x_h);
    pdgui_vmess(0, "crs ri rk", canvas, "itemconfigure", tag,
        "-width", zoom,
        "-outline", (x->x_gui.x_fsf.x_selected ? IEM_GUI_COLOR_SELECTED : x->x_gui.x_bcol));

    sprintf(tag, "%lxLABEL", x);
    pdgui_vmess(0, "crs ii", canvas, "coords", tag,
        xpos + x->x_gui.x_ldx * zoom,
        ypos + x->x_gui.x_ldy * zoom);
    pdgui_vmess(0, "crs rA rk", canvas, "itemconfigure", tag,
        "-font", 3, fontatoms,
        "-fill", x->x_gui.x_lcol);
    iemgui_dolabel(x, &x->x_gui, x->x_gui.x_lab, 1);
}